

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::(anonymous_namespace)::MicroStringPrevTest_AssignmentViaSetUnowned_Test
::~MicroStringPrevTest_AssignmentViaSetUnowned_Test
          (MicroStringPrevTest_AssignmentViaSetUnowned_Test *this)

{
  internal::anon_unknown_0::MicroStringPrevTest_AssignmentViaSetUnowned_Test::
  ~MicroStringPrevTest_AssignmentViaSetUnowned_Test
            ((MicroStringPrevTest_AssignmentViaSetUnowned_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, AssignmentViaSetUnowned) {
  MicroString source = MakeFromState(kUnowned, arena());
  const size_t used = arena_space_used();
  str_.Set(source, arena());
  EXPECT_EQ(str_.Get(), source.Get());
  // No new memory should be used when setting an unowned value.
  EXPECT_EQ(used, arena_space_used());
  EXPECT_EQ(0, str_.SpaceUsedExcludingSelfLong());
}